

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# qtransposeproxymodel.cpp
# Opt level: O2

QSize __thiscall QTransposeProxyModel::span(QTransposeProxyModel *this,QModelIndex *index)

{
  QAbstractItemModel *pQVar1;
  bool bVar2;
  int iVar3;
  parameter_type pQVar4;
  uint extraout_var;
  ulong uVar5;
  QObjectCompatProperty<QAbstractProxyModelPrivate,_QAbstractItemModel_*,_&QAbstractProxyModelPrivate::_qt_property_model_offset,_&QAbstractProxyModelPrivate::setModelForwarder,_&QAbstractProxyModelPrivate::modelChangedForwarder,_&QAbstractProxyModelPrivate::getModelForwarder>
  *this_00;
  ulong uVar6;
  long in_FS_OFFSET;
  undefined1 auStack_48 [24];
  long local_30;
  
  local_30 = *(long *)(in_FS_OFFSET + 0x28);
  uVar5 = 0xffffffff00000000;
  uVar6 = 0xffffffff;
  this_00 = (QObjectCompatProperty<QAbstractProxyModelPrivate,_QAbstractItemModel_*,_&QAbstractProxyModelPrivate::_qt_property_model_offset,_&QAbstractProxyModelPrivate::setModelForwarder,_&QAbstractProxyModelPrivate::modelChangedForwarder,_&QAbstractProxyModelPrivate::getModelForwarder>
             *)(*(long *)(this + 8) + 0xd8);
  pQVar4 = QObjectCompatProperty<QAbstractProxyModelPrivate,_QAbstractItemModel_*,_&QAbstractProxyModelPrivate::_qt_property_model_offset,_&QAbstractProxyModelPrivate::setModelForwarder,_&QAbstractProxyModelPrivate::modelChangedForwarder,_&QAbstractProxyModelPrivate::getModelForwarder>
           ::value(this_00);
  if (pQVar4 != (parameter_type)0x0) {
    bVar2 = QModelIndex::isValid(index);
    if (bVar2) {
      QObjectCompatProperty<QAbstractProxyModelPrivate,_QAbstractItemModel_*,_&QAbstractProxyModelPrivate::_qt_property_model_offset,_&QAbstractProxyModelPrivate::setModelForwarder,_&QAbstractProxyModelPrivate::modelChangedForwarder,_&QAbstractProxyModelPrivate::getModelForwarder>
      ::value(this_00);
      pQVar1 = (this_00->super_QPropertyData<QAbstractItemModel_*>).val;
      (**(code **)(*(long *)this + 400))(auStack_48,this,index);
      iVar3 = (*(pQVar1->super_QObject)._vptr_QObject[0x2b])(pQVar1,auStack_48);
      uVar6 = (ulong)extraout_var;
      uVar5 = CONCAT44(extraout_var,iVar3) << 0x20;
    }
  }
  if (*(long *)(in_FS_OFFSET + 0x28) == local_30) {
    return (QSize)(uVar5 | uVar6);
  }
  __stack_chk_fail();
}

Assistant:

QSize QTransposeProxyModel::span(const QModelIndex &index) const
{
    Q_D(const QTransposeProxyModel);
    Q_ASSERT(checkIndex(index));
    if (!d->model || !index.isValid())
        return QSize();
    return d->model->span(mapToSource(index)).transposed();
}